

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O1

void __thiscall libtorrent::torrent_info::internal_set_creator(torrent_info *this,string_view c)

{
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_38,c._M_str,c._M_str + c._M_len)
  ;
  ::std::__cxx11::string::operator=((string *)&this->m_created_by,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void torrent_info::internal_set_creator(string_view const c)
	{ m_created_by = std::string(c); }